

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

void plot_bitmap(tgestate_t *state,uint8_t *src,uint8_t *dst,uint8_t width,uint8_t height)

{
  uint8_t *slp;
  undefined7 in_register_00000009;
  uint8_t uVar1;
  ulong __n;
  
  __n = CONCAT71(in_register_00000009,width) & 0xffffffff;
  slp = dst;
  uVar1 = height;
  do {
    memcpy(slp,src,__n);
    src = src + __n;
    slp = get_next_scanline(state,slp);
    uVar1 = uVar1 + 0xff;
  } while (uVar1 != '\0');
  invalidate_bitmap(state,dst,(uint)width << 3,(uint)height);
  return;
}

Assistant:

void plot_bitmap(tgestate_t    *state,
                 const uint8_t *src,
                 uint8_t       *dst,
                 uint8_t        width,
                 uint8_t        height)
{
  uint8_t  h;
  uint8_t *curr_dst;

  assert(state != NULL);
  assert(src   != NULL);
  assert(dst   != NULL);
  assert(width  > 0);
  assert(height > 0);

  h        = height;
  curr_dst = dst;
  do
  {
    memcpy(curr_dst, src, width);
    src += width;
    curr_dst = get_next_scanline(state, curr_dst);
  }
  while (--h);

  /* Conv: Invalidation added over the original game. */
  invalidate_bitmap(state, dst, width * 8, height);
}